

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::dropEvent(QAbstractItemView *this,QDropEvent *event)

{
  long *plVar1;
  char cVar2;
  DragDropMode DVar3;
  QAbstractItemView *pQVar4;
  int iVar5;
  long in_FS_OFFSET;
  int row;
  int col;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(this + 8);
  DVar3 = dragDropMode(this);
  if (DVar3 == InternalMove) {
    pQVar4 = (QAbstractItemView *)QDropEvent::source();
    if ((pQVar4 != this) || (((byte)event[0x28] & 2) == 0)) goto LAB_004e4521;
  }
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  cVar2 = (**(code **)(*plVar1 + 0x110))(plVar1,event);
  if (cVar2 != '\0') {
    DVar3 = dragDropMode(this);
    if (DVar3 == InternalMove) {
      iVar5 = 2;
    }
    else {
      iVar5 = *(int *)(event + 0x2c);
    }
    cVar2 = (**(code **)(*(long *)plVar1[0x5f] + 0xe0))
                      ((long *)plVar1[0x5f],*(undefined8 *)(event + 0x38),iVar5,0xffffffff,
                       0xffffffff,&local_40);
    if (cVar2 != '\0') {
      if (iVar5 == *(int *)(event + 0x2c)) {
        *(undefined4 *)(event + 0x2c) = *(undefined4 *)(event + 0x30);
      }
      else {
        QDropEvent::setDropAction((DropAction)event);
      }
      event[0xc] = (QDropEvent)0x1;
    }
  }
  stopAutoScroll(this);
  *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
  QWidget::update((QWidget *)plVar1[0x56]);
LAB_004e4521:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::dropEvent(QDropEvent *event)
{
    Q_D(QAbstractItemView);
    if (dragDropMode() == InternalMove) {
        if (event->source() != this || !(event->possibleActions() & Qt::MoveAction))
            return;
    }

    QModelIndex index;
    int col = -1;
    int row = -1;
    if (d->dropOn(event, &row, &col, &index)) {
        const Qt::DropAction action = dragDropMode() == InternalMove ? Qt::MoveAction : event->dropAction();
        if (d->model->dropMimeData(event->mimeData(), action, row, col, index)) {
            if (action != event->dropAction()) {
                event->setDropAction(action);
                event->accept();
            } else {
                event->acceptProposedAction();
            }
        }
    }
    stopAutoScroll();
    setState(NoState);
    d->viewport->update();
}